

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void Js::FunctionBody::GetShortNameFromUrl(LPCWSTR pchUrl,LPWSTR pchShortName,size_t cchBuffer)

{
  WCHAR *local_30;
  LPCWSTR pchToCopy;
  LPCWSTR pchFile;
  size_t cchBuffer_local;
  LPWSTR pchShortName_local;
  LPCWSTR pchUrl_local;
  
  pchToCopy = PAL_wcsrchr(pchUrl,L'/');
  if (pchToCopy == (char16_t *)0x0) {
    pchToCopy = PAL_wcsrchr(pchUrl,L'\\');
  }
  local_30 = pchUrl;
  if (pchToCopy != (LPCWSTR)0x0) {
    local_30 = pchToCopy + 1;
  }
  wcscpy_s(pchShortName,cchBuffer,local_30);
  return;
}

Assistant:

void FunctionBody::GetShortNameFromUrl(__in LPCWSTR pchUrl, _Out_writes_z_(cchBuffer) LPWSTR pchShortName, __in size_t cchBuffer)
    {
        LPCWSTR pchFile = wcsrchr(pchUrl, _u('/'));
        if (pchFile == nullptr)
        {
            pchFile = wcsrchr(pchUrl, _u('\\'));
        }

        LPCWSTR pchToCopy = pchUrl;

        if (pchFile != nullptr)
        {
            pchToCopy = pchFile + 1;
        }

        wcscpy_s(pchShortName, cchBuffer, pchToCopy);
    }